

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_persistence_heat_map.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Persistence_heat_maps l;
  
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "This program creates a gnuplot script from a persistence heat maps stored in a file (the file needs "
                          );
  std::operator<<(poVar1,
                  "to be created beforehand). Please call the code with the name of a single heat maps file \n"
                 );
  if (argc != 2) {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
  }
  else {
    l.discrete = true;
    l.erase_below_diagonal = false;
    l.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    l.kernel.super__Function_base._M_functor._8_8_ = 0;
    l.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
    l.kernel._M_invoker = (_Invoker_type)0x0;
    l.interval.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    l.interval.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.interval.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    l.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    l.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    l.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    l.min_ = 0.0;
    l.max_ = 0.0;
    l.heat_map.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    l.heat_map.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.heat_map.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    l.number_of_functions_for_vectorization = 1;
    l.number_of_functions_for_projections_to_reals = 1;
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
    load_from_file(&l,argv[1]);
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::plot
              (&l,argv[1]);
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
    ~Persistence_heat_maps(&l);
  }
  return (uint)(argc != 2);
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates a gnuplot script from a persistence heat maps stored in a file (the file needs "
            << "to be created beforehand). Please call the code with the name of a single heat maps file \n";
  if (argc != 2) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }
  Persistence_heat_maps l;
  l.load_from_file(argv[1]);
  l.plot(argv[1]);
  return 0;
}